

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O2

void njoy::ENDFtk::section::Type<32,_151>::
     GeneralCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::ShortRangeBreitWignerBlock,_double,_njoy::ENDFtk::section::Type<32,_151>::GeneralMultiLevelBreitWigner>
     ::verifySize(int NSRS,int NLRS,int LRF)

{
  char *in_RAX;
  undefined8 *puVar1;
  char *args;
  
  if (NSRS < 0) {
    tools::Log::error<char_const*>(in_RAX);
    tools::Log::info<char_const*>(in_RAX);
    args = "NSRS value: {}";
    NLRS = NSRS;
  }
  else {
    if (LRF == 7) {
      if (NLRS == 0) {
        return;
      }
      tools::Log::error<char_const*>(in_RAX);
    }
    else {
      if (-1 < NLRS) {
        return;
      }
      tools::Log::error<char_const*>(in_RAX);
    }
    tools::Log::info<char_const*>(in_RAX);
    args = "NLRS value: {}";
  }
  tools::Log::info<char_const*,int>(args,NLRS);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NSRS, int NLRS, int LRF ) {

  if ( NSRS < 0 ) {

    Log::error( "Encountered illegal NSRS value" );
    Log::info( "NSRS should be larger than or equal to zero" );
    Log::info( "NSRS value: {}", NSRS );
    throw std::exception();
  }
  if ( LRF != 7 ) {

    if ( NLRS < 0) {

      Log::error( "Encountered illegal NLRS value" );
      Log::info( "NLRS should be larger than or equal to zero" );
      Log::info( "NLRS value: {}", NLRS );
      throw std::exception();
    }
  }
  else {

    if ( NLRS != 0 ) {

      Log::error( "Encountered illegal NLRS value" );
      Log::info( "NLRS should be zero for LRF=7 and LCOMP=1" );
      Log::info( "NLRS value: {}", NLRS );
      throw std::exception();
    }
  }
}